

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddCheckConstraint(Parse *pParse,Expr *pCheckExpr,char *zStart,char *zEnd)

{
  long lVar1;
  int iVar2;
  Db *pDVar3;
  Parse *in_RCX;
  Parse *in_RDX;
  long *in_RDI;
  long in_FS_OFFSET;
  sqlite3 *db;
  Table *pTab;
  Token t;
  Expr *p;
  sqlite3 *db_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = (sqlite3 *)in_RDI[0x2c];
  p = (Expr *)*in_RDI;
  if (((db_00 == (sqlite3 *)0x0) || (*(char *)((long)in_RDI + 0x134) == '\x01')) ||
     (iVar2 = sqlite3BtreeIsReadonly((Btree *)(p->x).pList[*(byte *)&p[2].w].a[0].pExpr), iVar2 != 0
     )) {
    sqlite3ExprDelete(db_00,p);
  }
  else {
    pDVar3 = (Db *)sqlite3ExprListAppend(in_RCX,(ExprList *)db_00,p);
    db_00->aDb = pDVar3;
    iVar2 = (int)((ulong)p >> 0x20);
    if ((int)in_RDI[0xf] == 0) {
      do {
        in_RDX = (Parse *)((long)&in_RDX->db + 1);
      } while ((""[*(byte *)&in_RDX->db] & 1) != 0);
      while ((""[*(byte *)((long)&in_RCX[-1].pRename + 7)] & 1) != 0) {
        in_RCX = (Parse *)((long)&in_RCX[-1].pRename + 7);
      }
      sqlite3ExprListSetName(in_RDX,(ExprList *)in_RCX,(Token *)db_00,iVar2);
    }
    else {
      sqlite3ExprListSetName(in_RDX,(ExprList *)in_RCX,(Token *)db_00,iVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddCheckConstraint(
  Parse *pParse,      /* Parsing context */
  Expr *pCheckExpr,   /* The check expression */
  const char *zStart, /* Opening "(" */
  const char *zEnd    /* Closing ")" */
){
#ifndef SQLITE_OMIT_CHECK
  Table *pTab = pParse->pNewTable;
  sqlite3 *db = pParse->db;
  if( pTab && !IN_DECLARE_VTAB
   && !sqlite3BtreeIsReadonly(db->aDb[db->init.iDb].pBt)
  ){
    pTab->pCheck = sqlite3ExprListAppend(pParse, pTab->pCheck, pCheckExpr);
    if( pParse->constraintName.n ){
      sqlite3ExprListSetName(pParse, pTab->pCheck, &pParse->constraintName, 1);
    }else{
      Token t;
      for(zStart++; sqlite3Isspace(zStart[0]); zStart++){}
      while( sqlite3Isspace(zEnd[-1]) ){ zEnd--; }
      t.z = zStart;
      t.n = (int)(zEnd - t.z);
      sqlite3ExprListSetName(pParse, pTab->pCheck, &t, 1);
    }
  }else
#endif
  {
    sqlite3ExprDelete(pParse->db, pCheckExpr);
  }
}